

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckForStyleAttribute(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *av;
  Node *node_00;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    av = prvTidyAttrGetById(node,TidyAttr_STYLE);
    BVar1 = hasValue(av);
    if (BVar1 != no) {
      prvTidyReportAccessError(doc,node,0x2d3);
    }
  }
  for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
    CheckForStyleAttribute(doc,node_00);
  }
  return;
}

Assistant:

static void CheckForStyleAttribute( TidyDocImpl* doc, Node* node )
{
    Node* content;
    if (Level1_Enabled( doc ))
    {
        /* Must not contain 'STYLE' attribute */
        AttVal* style = attrGetSTYLE( node );
        if ( hasValue(style) )
        {
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_STYLE_ATTR );
        }
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
        CheckForStyleAttribute( doc, content );
}